

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O3

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::FederateInfo::makeCLIApp(FederateInfo *this)

{
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *this_00;
  MultiOptionPolicy MVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  undefined8 uVar4;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  HelicsConfigJSON *pHVar5;
  App *pAVar6;
  Option *pOVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  CoreType type;
  CoreType type_00;
  code **in_RSI;
  _Any_data __tmp;
  _Any_data local_1198;
  code *local_1188;
  code *pcStack_1180;
  _Any_data local_1178;
  code *local_1168;
  undefined8 uStack_1160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1158;
  undefined8 local_1150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1148;
  undefined4 local_1138;
  undefined2 local_1134;
  string local_1130;
  _Any_data local_1110;
  code *local_1100;
  code *pcStack_10f8;
  _Any_data local_10f0;
  code *local_10e0;
  undefined8 uStack_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d0;
  undefined8 local_10c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10c0;
  undefined4 local_10b0;
  undefined2 local_10ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10a8;
  long *local_10a0;
  long local_1098;
  long local_1090 [2];
  string local_1080;
  _Any_data local_1060;
  code *local_1050;
  code *local_1048;
  string local_1040;
  _Any_data local_1020;
  code *local_1010;
  code *local_1008;
  _Any_data local_1000;
  code *local_ff0;
  code *local_fe8;
  string local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_fc0;
  long *local_fb8;
  long local_fb0;
  long local_fa8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f98;
  string local_f78;
  string local_f58;
  string local_f38;
  string local_f18;
  string local_ef8;
  string local_ed8;
  string local_eb8;
  string local_e98;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  undefined8 local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  undefined8 local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined4 local_398;
  undefined2 local_394;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  _Any_data local_368;
  code *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  undefined8 local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined4 local_328;
  undefined2 local_324;
  filter_fn_t local_318;
  filter_fn_t local_2f8;
  filter_fn_t local_2d8;
  filter_fn_t local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  _Any_data local_278;
  code *local_268;
  _Any_data local_258;
  code *local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined4 local_218;
  undefined1 local_214;
  undefined1 uStack_213;
  _Any_data local_210;
  code *local_200;
  _Any_data local_1f0;
  code *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined4 local_1b0;
  undefined1 local_1ac;
  undefined1 uStack_1ab;
  _Any_data local_1a8;
  code *local_198;
  _Any_data local_188;
  code *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined4 local_148;
  undefined1 local_144;
  undefined1 uStack_143;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_120;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[22]>((char (*) [22])this);
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  (pAVar6->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar6->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  pAVar6->allow_config_extras_ = ignore_all;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"--config-file,--config,config","");
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"helicsConfig.ini","");
  local_1198._M_unused._M_object = &local_1188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1198,"specify a configuration file","");
  CLI::App::set_config(pAVar6,&local_418,&local_438,(string *)&local_1198,false);
  if ((code **)local_1198._M_unused._0_8_ != &local_1188) {
    operator_delete(local_1198._M_unused._M_object,(ulong)(local_1188 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  pHVar5 = addJsonConfig((App *)(this->super_CoreFederateInfo).timeProps.
                                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  (pHVar5->super_ConfigBase).maximumLayers = '\0';
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"helics","");
  makeCLIApp();
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"--name,-n","");
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"name of the federate","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_458,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x14),
             &local_478);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"network type","");
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  pAVar6 = &CLI::App::add_option_group<CLI::Option_group>(pAVar6,&local_498,&local_4b8)->super_App;
  pAVar6->immediate_callback_ = true;
  p_Var2 = (pAVar6->final_callback_).super__Function_base._M_manager;
  if ((p_Var2 != (_Manager_type)0x0) &&
     ((pAVar6->parse_complete_callback_).super__Function_base._M_manager == (_Manager_type)0x0)) {
    local_1198._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(pAVar6->final_callback_).super__Function_base._M_functor;
    local_1198._8_8_ =
         *(undefined8 *)((long)&(pAVar6->final_callback_).super__Function_base._M_functor + 8);
    uVar4 = *(undefined8 *)
             ((long)&(pAVar6->parse_complete_callback_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(pAVar6->final_callback_).super__Function_base._M_functor =
         *(undefined8 *)&(pAVar6->parse_complete_callback_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(pAVar6->final_callback_).super__Function_base._M_functor + 8) = uVar4;
    *(undefined8 *)&(pAVar6->parse_complete_callback_).super__Function_base._M_functor =
         local_1198._M_unused._M_object;
    *(undefined8 *)((long)&(pAVar6->parse_complete_callback_).super__Function_base._M_functor + 8) =
         local_1198._8_8_;
    (pAVar6->final_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (pAVar6->parse_complete_callback_).super__Function_base._M_manager = p_Var2;
    p_Var3 = (pAVar6->final_callback_)._M_invoker;
    (pAVar6->final_callback_)._M_invoker = (pAVar6->parse_complete_callback_)._M_invoker;
    (pAVar6->parse_complete_callback_)._M_invoker = p_Var3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"--core","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:509:13)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:509:13)>
               ::_M_manager;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,"type or name of the core to connect to","");
  pOVar7 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar6,&local_4d8,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_1198,&local_4f8);
  helics::core::to_string_abi_cxx11_(&local_1130,(core *)(ulong)*(uint *)(in_RSI + 10),type);
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_1130,0,0,"(",1);
  local_1110._M_unused._M_object = (pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_unused._0_8_ == paVar9) {
    local_1100 = (code *)paVar9->_M_allocated_capacity;
    pcStack_10f8 = *(code **)((long)&pbVar8->field_2 + 8);
    local_1110._M_unused._M_object = &local_1100;
  }
  else {
    local_1100 = (code *)paVar9->_M_allocated_capacity;
  }
  local_1110._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1110,
                  ")");
  local_298._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p == paVar9) {
    local_298.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_298.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_298._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->default_str_,&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_1110._M_unused._0_8_ != &local_1100) {
    operator_delete(local_1110._M_unused._M_object,(ulong)(local_1100 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p,local_1130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"--force_new_core","");
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_538,"if set to true will force the federate to generate a new core",""
            );
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_518,(bool *)(in_RSI + 0xb),&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"--coretype,-t","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:523:13)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:523:13)>
               ::_M_manager;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_578,"type  of the core to connect to","");
  pOVar7 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar6,&local_558,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_1198,&local_578);
  helics::core::to_string_abi_cxx11_(&local_1130,(core *)(ulong)*(uint *)(in_RSI + 10),type_00);
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_1130,0,0,"(",1);
  local_1110._M_unused._M_object = (pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_unused._0_8_ == paVar9) {
    local_1100 = (code *)paVar9->_M_allocated_capacity;
    pcStack_10f8 = *(code **)((long)&pbVar8->field_2 + 8);
    local_1110._M_unused._M_object = &local_1100;
  }
  else {
    local_1100 = (code *)paVar9->_M_allocated_capacity;
  }
  local_1110._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1110,
                  ")");
  local_f98._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar9 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p == paVar9) {
    local_f98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f98.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
  }
  else {
    local_f98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_f98._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->default_str_,&local_f98);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"HELICS_CORE_TYPE","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->envname_,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  if ((code **)local_1110._M_unused._0_8_ != &local_1100) {
    operator_delete(local_1110._M_unused._M_object,(ulong)(local_1100 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p,local_1130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"--corename","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"the name of the core to create or find","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_598,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x18),
             &local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_fe0._M_dataplus._M_p = (pointer)&local_fe0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"--coreinitstring,-i","");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,"The initialization arguments for the core","");
  pOVar7 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar6,&local_fe0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x1c),&local_5d8);
  local_1198._M_unused._M_object = (void *)0x0;
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:536:21)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:536:21)>
               ::_M_manager;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"");
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"");
  pOVar7 = CLI::Option::transform
                     (pOVar7,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1198,&local_5f8,&local_618);
  MVar1 = (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != Join) {
    if (((MVar1 == Throw) && (pOVar7->expected_max_ == 0x20000000)) && (1 < pOVar7->expected_min_))
    {
      pOVar7->expected_max_ = pOVar7->expected_min_;
    }
    (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_ = Join;
    pOVar7->current_option_state_ = parsing;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"HELICS_CORE_INIT_STRING","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->envname_,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe0._M_dataplus._M_p != &local_fe0.field_2) {
    operator_delete(local_fe0._M_dataplus._M_p,local_fe0.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"--brokerinitstring","");
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_658,"The initialization arguments for the broker if autogenerated","")
  ;
  local_fc0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x20);
  pOVar7 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar6,&local_638,local_fc0,&local_658);
  local_1198._M_unused._M_object = (code **)0x0;
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:545:21)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:545:21)>
               ::_M_manager;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"");
  pOVar7 = CLI::Option::transform
                     (pOVar7,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1198,&local_678,&local_698);
  MVar1 = (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != Join) {
    if (((MVar1 == Throw) && (pOVar7->expected_max_ == 0x20000000)) && (1 < pOVar7->expected_min_))
    {
      pOVar7->expected_max_ = pOVar7->expected_min_;
    }
    (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_ = Join;
    pOVar7->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6b8,"--broker,--brokeraddress","");
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d8,"address or name of the broker to connect","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_6b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x24),
             &local_6d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"--brokerport","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,"Port number of the Broker","");
  local_10a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x24);
  pOVar7 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar6,&local_6f8,(int *)((long)in_RSI + 0x54),&local_718);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_1a8,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_188,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_168[0] = &local_158;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_144 = CLI::PositiveNumber._100_2_;
  local_148 = CLI::PositiveNumber._96_4_;
  local_1110._M_unused._M_object = &local_1100;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,"");
  _local_144 = CONCAT11(1,local_144);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar7->validators_,(Validator *)&local_1a8);
  if (local_1110._8_8_ != 0) {
    local_1198._M_unused._M_object = &local_1188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1198,local_1110._M_unused._M_object,
               local_1110._8_8_ + (long)local_1110._M_unused._0_8_);
    makeCLIApp();
  }
  if ((code **)local_1110._M_unused._0_8_ != &local_1100) {
    operator_delete(local_1110._M_unused._M_object,(ulong)(local_1100 + 1));
  }
  if (local_168[0] != &local_158) {
    operator_delete(local_168[0],local_158._M_allocated_capacity + 1);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"broker","");
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"broker specific options","")
  ;
  pAVar6 = CLI::App::add_subcommand(pAVar6,&local_738,&local_758);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"--host,--name","");
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_798,"address or name of the broker to connect","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_778,local_10a8,&local_798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"--port","");
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"port to connect to","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar6,&local_7b8,(int *)((long)in_RSI + 0x54),&local_7d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"--auto","");
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,"tell the core to automatically generate a broker if needed","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_7f8,(bool *)((long)in_RSI + 0x4d),&local_818);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"--key","");
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_858,
             "specify a key to use to match a broker should match the broker key","");
  local_10a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x28);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_838,local_10a8,&local_858);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"--initstring","");
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_898,"The initialization arguments for the broker if autogenerated","")
  ;
  pOVar7 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar6,&local_878,local_fc0,&local_898);
  local_1198._M_unused._M_object = (code **)0x0;
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:567:21)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:567:21)>
               ::_M_manager;
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"");
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"");
  pOVar7 = CLI::Option::transform
                     (pOVar7,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1198,&local_8b8,&local_8d8);
  MVar1 = (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != Join) {
    if (((MVar1 == Throw) && (pOVar7->expected_max_ == 0x20000000)) && (1 < pOVar7->expected_min_))
    {
      pOVar7->expected_max_ = pOVar7->expected_min_;
    }
    (pOVar7->super_OptionBase<CLI::Option>).multi_option_policy_ = Join;
    pOVar7->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"--port","");
  local_1110._8_8_ = 0;
  pcStack_10f8 = CLI::std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:574:12)>
                 ::_M_invoke;
  local_1100 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:574:12)>
               ::_M_manager;
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_918,"Specify the port number to use","");
  pOVar7 = CLI::App::add_option_function<int>
                     (pAVar6,&local_8f8,(function<void_(const_int_&)> *)&local_1110,&local_918);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_210,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_1f0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_1d0[0] = &local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_1ac = CLI::PositiveNumber._100_2_;
  local_1b0 = CLI::PositiveNumber._96_4_;
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1130,"");
  _local_1ac = CONCAT11(1,local_1ac);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar7->validators_,(Validator *)&local_210);
  if (local_1130._M_string_length != 0) {
    local_1198._M_unused._M_object = &local_1188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1198,local_1130._M_dataplus._M_p,
               local_1130._M_dataplus._M_p + local_1130._M_string_length);
    makeCLIApp();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p,local_1130.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0[0] != &local_1c0) {
    operator_delete(local_1d0[0],local_1c0._M_allocated_capacity + 1);
  }
  if (local_1e0 != (code *)0x0) {
    (*local_1e0)(&local_1f0,&local_1f0,__destroy_functor);
  }
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if (local_1100 != (code *)0x0) {
    (*local_1100)(&local_1110,&local_1110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_938,"--localport","");
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_958,"Port number to use for connections to this federate","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_938,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x2c),
             &local_958);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"--autobroker","");
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_998,"tell the core to automatically generate a broker if needed","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_978,(bool *)((long)in_RSI + 0x4d),&local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"--debugging","");
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d8,"tell the core to allow user debugging in a nicer fashion","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_9b8,(bool *)((long)in_RSI + 0x4e),&local_9d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f8,"--observer","");
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a18,"tell the federate/core that this federate is an observer","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_9f8,(bool *)((long)in_RSI + 0x4f),&local_a18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a38,"--allow_remote_control,!--disable_remote_control","");
  local_1000._8_8_ = 0;
  local_fe8 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:598:9)>
              ::_M_invoke;
  local_ff0 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:598:9)>
              ::_M_manager;
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a58,
             "enable the federate to respond to certain remote operations such as disconnect","");
  CLI::App::add_flag_function(pAVar6,&local_a38,(function<void_(long)> *)&local_1000,&local_a58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if (local_ff0 != (code *)0x0) {
    (*local_ff0)(&local_1000,&local_1000,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a78,"--json","");
  local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a98,
             "tell the core and federate to use JSON based serialization for all messages, to ensure compatibility"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar6,&local_a78,(bool *)((long)in_RSI + 0x59),&local_a98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab8,"--reentrant","");
  local_1020._8_8_ = 0;
  local_1008 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:606:9)>
               ::_M_invoke;
  local_1010 = CLI::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:606:9)>
               ::_M_manager;
  local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ad8,
             "specify that the federate can be reentrant (meaning it can stop and be restarted with the same name"
             ,"");
  CLI::App::add_flag_callback(pAVar6,&local_ab8,(function<void_()> *)&local_1020,&local_ad8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  if (local_1010 != (code *)0x0) {
    (*local_1010)(&local_1020,&local_1020,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"--profiler","");
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b18,
             "Enable profiling and specify a file name (NOTE: use --profiler_append=<filename> in the core init string to append to an existing file)"
             ,"");
  pOVar7 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar6,&local_af8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0xc),&local_b18);
  pOVar7->expected_min_ = 0;
  pOVar7->expected_max_ = 1;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"log","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->default_str_,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b38,"--broker_key,--brokerkey,--brokerKey","");
  local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b58,
             "specify a key to use to match a broker should match the broker key","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar6,&local_b38,local_10a8,&local_b58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"--offset","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:619:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:619:12)>
               ::_M_manager;
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b98,"the offset of the time steps (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_b78,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_b98);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bb8,"--period","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:624:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:624:12)>
               ::_M_manager;
  local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_bd8,"the execution cycle of the federate (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_bb8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_bd8);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
    operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf8,"--stoptime","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:629:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:629:12)>
               ::_M_manager;
  local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c18,"the maximum simulation time of a federate (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_bf8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_c18);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c38,"--timedelta","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:634:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:634:12)>
               ::_M_manager;
  local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c58,
             "The minimum time between time grants for a Federate (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_c38,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_c58);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
    operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"encryption","");
  local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c98,"options related to encryption","");
  pAVar6 = &CLI::App::add_option_group<CLI::Option_group>(pAVar6,&local_c78,&local_c98)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
    operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
    operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
  }
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"--encrypted","");
  local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_cd8,"enable encryption on the network","");
  pOVar7 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar6,&local_cb8,(bool *)((long)in_RSI + 0x5a),&local_cd8);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"HELICS_ENCRYPTION","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->envname_,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
  }
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf8,"--encryption_config","");
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d18,"set the configuration file for encryption options","");
  pOVar7 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar6,&local_cf8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x10),&local_d18);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"HELICS_ENCRYPTION_CONFIG","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->envname_,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d38,"realtime","");
  local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d58,"");
  pAVar6 = &CLI::App::add_option_group<CLI::Option_group>(pAVar6,&local_d38,&local_d58)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
    operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
  }
  (pAVar6->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d78,"--rtlag","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:651:13)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:651:13)>
               ::_M_manager;
  local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d98,
             "the amount of the time the federate is allowed to lag realtime before corrective action is taken (default in ms)"
             ,"");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_d78,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_d98);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
    operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
  }
  local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_db8,"--rtlead","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:658:13)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:658:13)>
               ::_M_manager;
  local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_dd8,
             "the amount of the time the federate is allowed to lead realtime before corrective action is taken (default in ms)"
             ,"");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_db8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_dd8);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
    operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
  }
  local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df8,"--rttolerance","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:665:13)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:665:13)>
               ::_M_manager;
  local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e18,"the time tolerance of the real time mode (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_df8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_e18);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
    operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e38,"--inputdelay","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:671:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:671:12)>
               ::_M_manager;
  local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e58,
             "the INPUT delay on incoming communication of the federate (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_e38,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_e58);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
    operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e78,"--outputdelay","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:676:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:676:12)>
               ::_M_manager;
  local_e98._M_dataplus._M_p = (pointer)&local_e98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e98,
             "the output delay for outgoing communication of the federate (default in ms)","");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_e78,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_e98);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
    operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
    operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_eb8._M_dataplus._M_p = (pointer)&local_eb8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb8,"--grant_timeout","");
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:681:12)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:681:12)>
               ::_M_manager;
  local_1198._M_unused._0_8_ = in_RSI;
  local_ed8._M_dataplus._M_p = (pointer)&local_ed8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ed8,
             "timeout to trigger diagnostic action when a federate time grant is not available within the timeout period (default in ms)"
             ,"");
  pOVar7 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar6,&local_eb8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1198,&local_ed8);
  (pOVar7->super_OptionBase<CLI::Option>).configurable_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != &local_ed8.field_2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
    operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_ef8._M_dataplus._M_p = (pointer)&local_ef8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef8,"--maxiterations","");
  local_1110._8_8_ = 0;
  pcStack_10f8 = CLI::std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:686:12)>
                 ::_M_invoke;
  local_1100 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:686:12)>
               ::_M_manager;
  local_1110._M_unused._0_8_ = in_RSI;
  local_f18._M_dataplus._M_p = (pointer)&local_f18.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f18,"the maximum number of iterations a federate is allowed to take",
             "");
  pOVar7 = CLI::App::add_option_function<int>
                     (pAVar6,&local_ef8,(function<void_(const_int_&)> *)&local_1110,&local_f18);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_278,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_258,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_238[0] = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_214 = CLI::PositiveNumber._100_2_;
  local_218 = CLI::PositiveNumber._96_4_;
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1130,"");
  _local_214 = CONCAT11(1,local_214);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar7->validators_,(Validator *)&local_278);
  if (local_1130._M_string_length != 0) {
    local_1198._M_unused._M_object = &local_1188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1198,local_1130._M_dataplus._M_p,
               local_1130._M_dataplus._M_p + local_1130._M_string_length);
    makeCLIApp();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p,local_1130.field_2._M_allocated_capacity + 1);
  }
  if (local_238[0] != &local_228) {
    operator_delete(local_238[0],local_228._M_allocated_capacity + 1);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
    operator_delete(local_f18._M_dataplus._M_p,local_f18.field_2._M_allocated_capacity + 1);
  }
  if (local_1100 != (code *)0x0) {
    (*local_1100)(&local_1110,&local_1110,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_1040._M_dataplus._M_p = (pointer)&local_1040.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1040,"--loglevel","");
  local_1060._8_8_ = 0;
  local_1048 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:691:12)>
               ::_M_invoke;
  local_1050 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:691:12)>
               ::_M_manager;
  local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1080,"the logging level of a federate","");
  pOVar7 = CLI::App::add_option_function<int>
                     (pAVar6,&local_1040,(function<void_(const_int_&)> *)&local_1060,&local_1080);
  local_118 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)log_level_map_abi_cxx11_;
  local_2b8.super__Function_base._M_functor._8_8_ = 0;
  local_2b8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_2b8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_2b8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_2d8.super__Function_base._M_functor._8_8_ = 0;
  local_2d8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_2d8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_2d8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_1198,&local_118,&local_2b8,&local_2d8);
  local_3f8._M_unused._M_object = (code **)0x0;
  local_3f8._8_8_ = 0;
  local_3e8 = (code *)0x0;
  local_3e0 = pcStack_1180;
  if (local_1188 != (code *)0x0) {
    local_3f8._M_unused._M_object = local_1198._M_unused._M_object;
    local_3f8._8_8_ = local_1198._8_8_;
    local_3e8 = local_1188;
    local_1188 = (code *)0x0;
    pcStack_1180 = (code *)0x0;
  }
  local_3d8._M_unused._M_object = (void *)0x0;
  local_3d8._8_8_ = 0;
  local_3c8 = (code *)0x0;
  local_3c0 = uStack_1160;
  if (local_1168 != (code *)0x0) {
    local_3d8._M_unused._M_object = local_1178._M_unused._M_object;
    local_3d8._8_8_ = local_1178._8_8_;
    local_3c8 = local_1168;
    local_1168 = (code *)0x0;
    uStack_1160 = 0;
  }
  local_3b8 = &local_3a8;
  if (local_1158 == &local_1148) {
    local_3a8._8_4_ = local_1148._8_4_;
    local_3a8._12_4_ = local_1148._12_4_;
  }
  else {
    local_3b8 = local_1158;
  }
  local_3a8._M_allocated_capacity._4_4_ = local_1148._M_allocated_capacity._4_4_;
  local_3a8._M_allocated_capacity._0_4_ = local_1148._M_allocated_capacity._0_4_;
  local_3b0 = local_1150;
  local_1150 = 0;
  local_1148._M_allocated_capacity._0_4_ = local_1148._M_allocated_capacity._0_4_ & 0xffffff00;
  local_398 = local_1138;
  local_394 = local_1134;
  local_10a0 = local_1090;
  local_1158 = &local_1148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10a0,"");
  this_00 = &pOVar7->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (this_00,(pOVar7->validators_).
                     super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                     super__Vector_impl_data._M_start,(value_type *)&local_3f8);
  if (local_1098 != 0) {
    local_1110._M_unused._M_object = &local_1100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1110,local_10a0,local_1098 + (long)local_10a0);
    makeCLIApp();
  }
  local_120 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)log_level_map_abi_cxx11_;
  local_2f8.super__Function_base._M_functor._8_8_ = 0;
  local_2f8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_2f8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_2f8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_318.super__Function_base._M_functor._8_8_ = 0;
  local_318.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_318._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_318.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_1110,&local_120,&local_2f8,&local_318);
  local_388._M_unused._M_object = (code **)0x0;
  local_388._8_8_ = 0;
  local_378 = (code *)0x0;
  local_370 = pcStack_10f8;
  if (local_1100 != (code *)0x0) {
    local_388._M_unused._M_object = local_1110._M_unused._M_object;
    local_388._8_8_ = local_1110._8_8_;
    local_378 = local_1100;
    local_1100 = (code *)0x0;
    pcStack_10f8 = (code *)0x0;
  }
  local_368._M_unused._M_object = (void *)0x0;
  local_368._8_8_ = 0;
  local_358 = (code *)0x0;
  local_350 = uStack_10d8;
  if (local_10e0 != (code *)0x0) {
    local_368._M_unused._M_object = local_10f0._M_unused._M_object;
    local_368._8_8_ = local_10f0._8_8_;
    local_358 = local_10e0;
    local_10e0 = (code *)0x0;
    uStack_10d8 = 0;
  }
  if (local_10d0 == &local_10c0) {
    local_338._8_4_ = local_10c0._8_4_;
    local_338._12_4_ = local_10c0._12_4_;
    local_348 = &local_338;
  }
  else {
    local_348 = local_10d0;
  }
  local_338._M_allocated_capacity._4_4_ = local_10c0._M_allocated_capacity._4_4_;
  local_338._M_allocated_capacity._0_4_ = local_10c0._M_allocated_capacity._0_4_;
  local_340 = local_10c8;
  local_10c8 = 0;
  local_10c0._M_allocated_capacity._0_4_ = local_10c0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_328 = local_10b0;
  local_324 = local_10ac;
  local_10d0 = &local_10c0;
  local_fb8 = local_fa8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb8,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (this_00,(this_00->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                     _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_388);
  if (local_fb0 != 0) {
    local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1130,local_fb8,local_fb0 + (long)local_fb8);
    makeCLIApp();
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"HELICS_LOG_LEVEL","");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->envname_,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (local_fb8 != local_fa8) {
    operator_delete(local_fb8,local_fa8[0] + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,local_338._M_allocated_capacity + 1);
  }
  if (local_358 != (code *)0x0) {
    (*local_358)(&local_368,&local_368,__destroy_functor);
  }
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  if (local_10d0 != &local_10c0) {
    operator_delete(local_10d0,
                    CONCAT44(local_10c0._M_allocated_capacity._4_4_,
                             local_10c0._M_allocated_capacity._0_4_) + 1);
  }
  if (local_10e0 != (code *)0x0) {
    (*local_10e0)(&local_10f0,&local_10f0,__destroy_functor);
  }
  if (local_1100 != (code *)0x0) {
    (*local_1100)(&local_1110,&local_1110,3);
  }
  if (local_318.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_318.super__Function_base._M_manager)
              ((_Any_data *)&local_318,(_Any_data *)&local_318,__destroy_functor);
  }
  if (local_2f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2f8.super__Function_base._M_manager)
              ((_Any_data *)&local_2f8,(_Any_data *)&local_2f8,__destroy_functor);
  }
  if (local_10a0 != local_1090) {
    operator_delete(local_10a0,local_1090[0] + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8._M_allocated_capacity + 1);
  }
  if (local_3c8 != (code *)0x0) {
    (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
  }
  if (local_3e8 != (code *)0x0) {
    (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
  }
  if (local_1158 != &local_1148) {
    operator_delete(local_1158,
                    CONCAT44(local_1148._M_allocated_capacity._4_4_,
                             local_1148._M_allocated_capacity._0_4_) + 1);
  }
  if (local_1168 != (code *)0x0) {
    (*local_1168)(&local_1178,&local_1178,__destroy_functor);
  }
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if (local_2d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2d8.super__Function_base._M_manager)
              ((_Any_data *)&local_2d8,(_Any_data *)&local_2d8,__destroy_functor);
  }
  if (local_2b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2b8.super__Function_base._M_manager)
              ((_Any_data *)&local_2b8,(_Any_data *)&local_2b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
    operator_delete(local_1080._M_dataplus._M_p,local_1080.field_2._M_allocated_capacity + 1);
  }
  if (local_1050 != (code *)0x0) {
    (*local_1050)(&local_1060,&local_1060,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
    operator_delete(local_1040._M_dataplus._M_p,local_1040.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_f38._M_dataplus._M_p = (pointer)&local_f38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f38,"--separator","");
  local_f58._M_dataplus._M_p = (pointer)&local_f58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f58,"separator character for local federates","");
  pOVar7 = CLI::App::add_option<char,_char,_(CLI::detail::enabler)0>
                     (pAVar6,&local_f38,(char *)((long)in_RSI + 0x4c),&local_f58);
  local_70.field_2._M_local_buf[0] = *(char *)((long)in_RSI + 0x4c);
  local_70._M_string_length = 1;
  local_70.field_2._M_local_buf[1] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar7->default_str_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_70.field_2._M_local_buf[1],
                                      local_70.field_2._M_local_buf[0])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
    operator_delete(local_f58._M_dataplus._M_p,local_f58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f38._M_dataplus._M_p != &local_f38.field_2) {
    operator_delete(local_f38._M_dataplus._M_p,local_f38.field_2._M_allocated_capacity + 1);
  }
  pAVar6 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f78,"--flags,-f,--flag","");
  pOVar7 = CLI::App::add_option<const_char[28],_(CLI::detail::enabler)0>
                     (pAVar6,&local_f78,(char (*) [28])"named flag for the federate");
  pOVar7->type_size_max_ = 1;
  pOVar7->type_size_min_ = 1;
  pOVar7->expected_max_ = 0x20000000;
  (pOVar7->super_OptionBase<CLI::Option>).delimiter_ = ',';
  local_1198._8_8_ = 0;
  pcStack_1180 = CLI::std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:704:16)>
                 ::_M_invoke;
  local_1188 = CLI::std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:704:16)>
               ::_M_manager;
  CLI::Option::each(pOVar7,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_1198);
  if (local_1188 != (code *)0x0) {
    (*local_1188)(&local_1198,&local_1198,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
    operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
  }
  *(undefined1 *)
   &((TimeRepresentation<count_time<9,_long>_> *)
    ((long)((this->super_CoreFederateInfo).timeProps.
            super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 4) + 8))->internalTimeCode = 1;
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> FederateInfo::makeCLIApp()
{
    /*
    The parser for the command line options ignores underscores and cases so
    there's no need to explicitly support all three case styles. If users type
    in any of the normal HELICS variants (nocase, camelCase, and snake_case) it
    will work.
    */
    auto app = std::make_unique<helicsCLI11App>("Federate Info Parsing");
    app->option_defaults()->ignore_case()->ignore_underscore();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->set_config("--config-file,--config,config",
                    "helicsConfig.ini",
                    "specify a configuration file");

    auto* fmtr = addJsonConfig(app.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    app->add_option("--name,-n", defName, "name of the federate");
    auto* networking = app->add_option_group("network type")->immediate_callback();
    networking
        ->add_option_function<std::string>(
            "--core",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    coreName = val;
                }
            },
            "type or name of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")");
    networking->add_flag("--force_new_core",
                         forceNewCore,
                         "if set to true will force the federate to generate a new core");
    networking
        ->add_option_function<std::string>(
            "--coretype,-t",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    throw CLI::ValidationError(val + " is NOT a recognized core type");
                }
            },
            "type  of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")")
        ->envname("HELICS_CORE_TYPE");
    app->add_option("--corename", coreName, "the name of the core to create or find");
    app->add_option("--coreinitstring,-i",
                    coreInitString,
                    "The initialization arguments for the core")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join)
        ->envname("HELICS_CORE_INIT_STRING");
    app->add_option("--brokerinitstring",
                    brokerInitString,
                    "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option("--broker,--brokeraddress", broker, "address or name of the broker to connect");
    app->add_option("--brokerport", brokerPort, "Port number of the Broker")
        ->check(CLI::PositiveNumber);

    auto* brokersub = app->add_subcommand("broker", "broker specific options");
    brokersub->add_option("--host,--name", broker, "address or name of the broker to connect");
    brokersub->add_option("--port", brokerPort, "port to connect to");
    brokersub->add_flag("--auto",
                        autobroker,
                        "tell the core to automatically generate a broker if needed");
    brokersub->add_option("--key",
                          key,
                          "specify a key to use to match a broker should match the broker key");
    brokersub
        ->add_option("--initstring",
                     brokerInitString,
                     "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option_function<int>(
           "--port",
           [this](int port) {
               if (brokerPort > 0) {
                   localport = std::to_string(port);
               } else {
                   brokerPort = port;
               }
           },
           "Specify the port number to use")
        ->check(CLI::PositiveNumber);
    app->add_option("--localport",
                    localport,
                    "Port number to use for connections to this federate");
    app->add_flag("--autobroker",
                  autobroker,
                  "tell the core to automatically generate a broker if needed");
    app->add_flag("--debugging",
                  debugging,
                  "tell the core to allow user debugging in a nicer fashion");
    app->add_flag("--observer",
                  observer,
                  "tell the federate/core that this federate is an observer");
    // this is added here to match the command arguments for a broker, also works as a flag
    app->add_flag_function(
        "--allow_remote_control,!--disable_remote_control",
        [this](int64_t val) { setFlagOption(HELICS_FLAG_ALLOW_REMOTE_CONTROL, (val > 0)); },
        "enable the federate to respond to certain remote operations such as disconnect");
    app->add_flag(
        "--json",
        useJsonSerialization,
        "tell the core and federate to use JSON based serialization for all messages, to ensure compatibility");
    app->add_flag_callback(
        "--reentrant",
        [this]() { setFlagOption(HELICS_FLAG_REENTRANT, true); },
        "specify that the federate can be reentrant (meaning it can stop and be restarted with the same name");
    app->add_option(
           "--profiler",
           profilerFileName,
           "Enable profiling and specify a file name (NOTE: use --profiler_append=<filename> in the core init string to append to an existing file)")
        ->expected(0, 1)
        ->default_str("log");
    app->add_option("--broker_key,--brokerkey,--brokerKey",
                    key,
                    "specify a key to use to match a broker should match the broker key");
    app->add_option_function<Time>(
           "--offset",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OFFSET, val); },
           "the offset of the time steps (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--period",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_PERIOD, val); },
           "the execution cycle of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--stoptime",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_STOPTIME, val); },
           "the maximum simulation time of a federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--timedelta",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_DELTA, val); },
           "The minimum time between time grants for a Federate (default in ms)")
        ->configurable(false);
    auto* encrypt_group = app->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    auto* rtgroup = app->add_option_group("realtime");
    rtgroup->option_defaults()->ignore_underscore();
    rtgroup
        ->add_option_function<Time>(
            "--rtlag",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LAG, val); },
            "the amount of the time the federate is allowed to lag realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rtlead",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LEAD, val); },
            "the amount of the time the federate is allowed to lead realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rttolerance",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_TOLERANCE, val); },
            "the time tolerance of the real time mode (default in ms)")
        ->configurable(false);

    app->add_option_function<Time>(
           "--inputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_INPUT_DELAY, val); },
           "the INPUT delay on incoming communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--outputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, val); },
           "the output delay for outgoing communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--grant_timeout",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_GRANT_TIMEOUT, val); },
           "timeout to trigger diagnostic action when a federate time grant is not available within the timeout period (default in ms)")
        ->configurable(false);
    app->add_option_function<int>(
           "--maxiterations",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_MAX_ITERATIONS, val); },
           "the maximum number of iterations a federate is allowed to take")
        ->check(CLI::PositiveNumber);
    app->add_option_function<int>(
           "--loglevel",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_LOG_LEVEL, val); },
           "the logging level of a federate")
        ->transform(
            CLI::CheckedTransformer(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))

        ->transform(CLI::IsMember(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))
        ->envname("HELICS_LOG_LEVEL");

    app->add_option("--separator", separator, "separator character for local federates")
        ->default_str(std::string(1, separator));
    app->add_option("--flags,-f,--flag", "named flag for the federate")
        ->type_size(-1)
        ->delimiter(',')
        ->each([this](const std::string& flag) { loadFlags(*this, flag); });
    app->allow_extras();
#ifdef HELICS_DISABLE_ASIO
    rtgroup->disabled();
#endif
    return app;
}